

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::FindCMakeResources(char *argv0)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  string exe_dir;
  string src_dir_txt;
  string src_dir;
  string dir;
  string exe;
  string errorMsg;
  string prefix;
  ifstream fin2;
  string local_500;
  long *local_4e0 [2];
  long local_4d0 [2];
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  byte abStack_420 [488];
  string local_238;
  byte abStack_218 [488];
  
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  local_460._M_string_length = 0;
  local_460.field_2._M_local_buf[0] = '\0';
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  bVar3 = cmsys::SystemTools::FindProgramPath
                    (argv0,&local_480,&local_460,(char *)0x0,(char *)0x0,(char *)0x0);
  if (bVar3) {
    cmsys::SystemTools::GetRealPath(&local_440,&local_480,(string *)0x0);
    std::__cxx11::string::operator=((string *)&local_480,(string *)&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenamePath(&local_440,&local_480);
    std::__cxx11::string::operator=((string *)&local_500,(string *)&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::GetActualCaseForPath(&local_440,&local_500);
  std::__cxx11::string::operator=((string *)&local_500,(string *)&local_440);
  paVar1 = &local_440.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar1) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCommand_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCTestCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCTestCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCTestCommand_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCPackCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCPackCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCPackCommand_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  bVar3 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar3) {
    cmSystemToolsCMakeGUICommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeGUICommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  bVar3 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar3) {
    cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  std::__cxx11::string::append((char *)&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  cmsys::SystemTools::GetExecutableExtension();
  std::__cxx11::string::append((char *)&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  bVar3 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar3) {
    cmSystemToolsCMClDepsCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMClDepsCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  local_440._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"/bin","");
  if (local_500._M_string_length < local_440._M_string_length) {
    bVar3 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((ulong)&local_500,local_500._M_string_length - local_440._M_string_length,
                       (string *)local_440._M_string_length);
    bVar3 = iVar4 == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar1) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__cxx11::string::substr((ulong)&local_440,(ulong)&local_500);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_440._M_dataplus._M_p,
               (string *)(local_440._M_string_length + (long)local_440._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::operator=
              ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if (cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_440,cmSystemToolsCMakeRoot_abi_cxx11_._M_dataplus._M_p,
               cmSystemToolsCMakeRoot_abi_cxx11_._M_dataplus._M_p +
               cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)&local_440);
    bVar3 = cmsys::SystemTools::FileExists(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != paVar1) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) goto LAB_0026884b;
  }
  cmsys::SystemTools::GetFilenamePath(&local_4a0,&local_500);
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4e0,local_4a0._M_dataplus._M_p,
             local_4a0._M_dataplus._M_p + local_4a0._M_string_length);
  std::__cxx11::string::append((char *)local_4e0);
  std::ifstream::ifstream(&local_440,(char *)local_4e0[0],_S_in);
  paVar1 = &local_4c0.field_2;
  local_4c0._M_string_length = 0;
  local_4c0.field_2._M_local_buf[0] = '\0';
  local_4c0._M_dataplus._M_p = (pointer)paVar1;
  if ((abStack_420[*(long *)(local_440._M_dataplus._M_p + -0x18)] & 5) == 0) {
    bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&local_440,&local_4c0,(bool *)0x0,-1);
    if (!bVar3) goto LAB_002686d8;
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_4c0);
    if (!bVar3) goto LAB_002686d8;
    std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
  }
  else {
LAB_002686d8:
    cmsys::SystemTools::GetFilenamePath(&local_238,&local_4a0);
    std::__cxx11::string::operator=((string *)&local_4a0,(string *)&local_238);
    paVar2 = &local_238.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_238._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,local_4a0._M_dataplus._M_p,
               local_4a0._M_dataplus._M_p + local_4a0._M_string_length);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::operator=((string *)local_4e0,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::ifstream(&local_238,(char *)local_4e0[0],_S_in);
    if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
      bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&local_238,&local_4c0,(bool *)0x0,-1)
      ;
      if (bVar3) {
        bVar3 = cmsys::SystemTools::FileIsDirectory(&local_4c0);
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
        }
      }
    }
    std::ifstream::~ifstream(&local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4c0._M_dataplus._M_p,
                    CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                             local_4c0.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(&local_440);
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
LAB_0026884b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,
                    CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                             local_480.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,
                    CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                             local_460.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,
                    CONCAT71(local_500.field_2._M_allocated_capacity._1_7_,
                             local_500.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while (start != s.end() && cm_isspace(*start)) {
    ++start;
  }
  if (start == s.end()) {
    return "";
  }
  std::string::const_iterator stop = s.end() - 1;
  while (cm_isspace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}